

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O3

int64_t interpolation_filter_rd
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_luma,RD_STATS *rd_stats,
                  int *switchable_rate,BUFFER_SET **dst_bufs,int filter_idx,int *switchable_ctx,
                  int skip_pred)

{
  uint8_t uVar1;
  uint uVar2;
  int_interpfilters iVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  int iVar6;
  macroblockd_plane *pmVar7;
  BLOCK_SIZE BVar8;
  byte bVar9;
  undefined7 in_register_00000009;
  MACROBLOCKD *pMVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  buf_2d *pbVar14;
  uint uVar15;
  long lVar16;
  uint8_t *puVar17;
  int iVar18;
  int iVar19;
  undefined4 in_stack_0000002c;
  undefined4 uStack_f8;
  undefined3 uStack_f4;
  byte local_f0;
  undefined7 uStack_ef;
  long local_e8;
  uint local_dc;
  uint local_d8;
  long local_d0;
  undefined8 local_b8;
  int64_t iStack_b0;
  undefined8 uStack_a8;
  int64_t iStack_a0;
  undefined8 local_98;
  MB_MODE_INFO *local_90;
  long local_88;
  AV1_COMP *local_80;
  long local_78;
  long local_70;
  byte local_68;
  undefined7 uStack_67;
  long local_60;
  uint local_58;
  uint local_54;
  MACROBLOCKD *local_50;
  AV1_COMMON *local_48;
  uint *local_40;
  long local_38;
  
  local_88 = CONCAT44(local_88._4_4_,(int)tile_data);
  lVar16 = local_88;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_90 = *(x->e_mbd).mi;
  local_b8._0_4_ = (uint)*rd;
  uVar15 = *(uint *)((long)rd + 4);
  lVar12 = rd[1];
  local_e8 = rd[2];
  lVar13 = rd[3];
  local_f0 = *(byte *)(rd + 4);
  uStack_ef = (undefined7)((ulong)local_e8 >> 8);
  uStack_f4 = (undefined3)((uint)*(undefined4 *)((long)rd + 0x24) >> 8);
  uStack_f8 = *(undefined4 *)((long)rd + 0x21);
  uVar2 = filter_sets[(ulong)dst_bufs & 0xffffffff].as_int;
  iVar3 = local_90->interp_filters;
  (local_90->interp_filters).as_int = uVar2;
  iVar18 = (x->mode_costs).switchable_interp_costs[*(int *)CONCAT44(in_stack_0000002c,filter_idx)]
           [uVar2 & 0xff];
  if (((cpi->common).seq_params)->enable_dual_filter != '\0') {
    iVar18 = iVar18 + *(int *)((long)(x->mode_costs).switchable_interp_costs
                                     [((int *)CONCAT44(in_stack_0000002c,filter_idx))[1]] +
                              (ulong)(uVar2 >> 0xe & 0x3fc));
  }
  if ((long)x->rdmult * (long)iVar18 + 0x100 >> 9 <= (long)orig_dst->plane[0]) {
    iVar19 = 3;
    if ((cpi->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
      iVar19 = (int)switchable_ctx;
    }
    if (iVar19 == 3) {
      local_b8._0_4_ = rd_stats_luma->rate;
      uVar15 = rd_stats_luma->zero_rate;
      lVar12 = rd_stats_luma->dist;
      local_e8 = rd_stats_luma->rdcost;
      lVar13 = rd_stats_luma->sse;
      local_f0 = rd_stats_luma->skip_txfm;
      uStack_f4 = (undefined3)((uint)*(undefined4 *)&rd_stats_luma->field_0x24 >> 8);
      uStack_f8 = *(undefined4 *)&rd_stats_luma->field_0x21;
      local_d0 = 0;
      local_68 = 1;
      uStack_67 = (int7)((ulong)local_e8 >> 8);
      local_70 = 0;
      local_78 = 0;
      local_dc = 0;
      local_d8 = 0;
      local_80 = cpi;
    }
    else {
      local_48 = &cpi->common;
      pMVar10 = &x->e_mbd;
      local_50 = pMVar10;
      local_60 = 0;
      local_80 = cpi;
      if (iVar19 == 1) {
        local_68 = 1;
        uStack_67 = uStack_ef;
        local_70 = 0;
        local_78 = 0;
        local_dc = 0;
        local_d8 = 0;
      }
      else {
        if (iVar19 != 0) {
          return 0;
        }
        local_b8 = 0;
        iStack_b0 = 0;
        uStack_a8 = 0;
        iStack_a0 = 0;
        local_98 = CONCAT71(local_98._1_7_,1);
        local_88._0_1_ = (BLOCK_SIZE)tile_data;
        BVar8 = (BLOCK_SIZE)local_88;
        local_88 = lVar16;
        av1_enc_build_inter_predictor
                  (&cpi->common,pMVar10,(x->e_mbd).mi_row,(x->e_mbd).mi_col,
                   (BUFFER_SET *)CONCAT71(in_register_00000009,bsize),BVar8,0,0);
        cpi = local_80;
        (*model_rd_sb_fn[(local_80->sf).rt_sf.use_simple_rd_model == 0])
                  (local_80,BVar8,x,pMVar10,0,0,(int *)&local_b8,&iStack_b0,(uint8_t *)&local_98,
                   &iStack_a0,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
        if ((uint)local_b8 == 0x7fffffff) {
          local_e8 = 0x7fffffffffffffff;
          lVar13 = 0x7fffffffffffffff;
          local_f0 = 0;
          uStack_ef = 0;
          lVar12 = 0x7fffffffffffffff;
          uVar15 = 0;
        }
        else {
          local_e8 = 0;
          lVar13 = iStack_a0;
          if (iStack_a0 == 0x7fffffffffffffff) {
            lVar13 = local_e8;
          }
          uStack_ef = (undefined7)((ulong)pMVar10 >> 8);
          local_f0 = (byte)local_98 & 1;
          lVar12 = iStack_b0;
          uVar15 = local_b8._4_4_;
        }
        local_68 = local_f0;
        uStack_67 = uStack_ef;
        local_78 = lVar13;
        local_70 = local_e8;
        local_60 = lVar12;
        local_d8 = (uint)local_b8;
        local_dc = uVar15;
      }
      pMVar10 = local_50;
      uVar11 = (ulong)(uint)local_b8;
      if (uVar1 == '\0') {
        iVar19 = 1;
        BVar8 = (BLOCK_SIZE)local_88;
        local_58 = (uint)(BLOCK_SIZE)local_88;
        lVar16 = local_e8;
        local_40 = (uint *)rd;
        uStack_67 = uStack_ef;
        do {
          iVar6 = (int)uVar11;
          if ((long)orig_dst->plane[0] <=
              lVar12 * 0x80 + ((long)x->rdmult * (long)(iVar6 + iVar18) + 0x100 >> 9)) {
            local_90->interp_filters = iVar3;
            return 0;
          }
          iStack_a0 = 0;
          iStack_b0 = 0;
          uStack_a8 = 0;
          local_98 = CONCAT71(local_98._1_7_,1);
          local_b8 = 0;
          local_88 = lVar12;
          local_54 = uVar15;
          local_38 = lVar13;
          av1_enc_build_inter_predictor
                    (local_48,pMVar10,(x->e_mbd).mi_row,(x->e_mbd).mi_col,
                     (BUFFER_SET *)CONCAT71(in_register_00000009,bsize),BVar8,iVar19,iVar19);
          (*model_rd_sb_fn[(local_80->sf).rt_sf.use_simple_rd_model == 0])
                    (local_80,BVar8,x,pMVar10,iVar19,iVar19,(int *)&local_b8,&iStack_b0,
                     (uint8_t *)&local_98,&iStack_a0,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
          uVar11 = 0x7fffffff;
          if (iVar6 == 0x7fffffff) {
            lVar13 = 0x7fffffffffffffff;
            uVar15 = 0;
            lVar12 = 0x7fffffffffffffff;
            local_e8 = 0x7fffffffffffffff;
            bVar9 = 0;
          }
          else {
            lVar13 = 0x7fffffffffffffff;
            uVar15 = 0;
            lVar12 = lVar13;
            local_e8 = lVar13;
            bVar9 = 0;
            if ((long)(int)(uint)local_b8 != 0x7fffffff) {
              uVar11 = (long)(int)(uint)local_b8 + (long)iVar6;
              if (0x7ffffffe < (long)uVar11) {
                uVar11 = 0x7fffffff;
              }
              uVar15 = local_54;
              if (local_54 == 0) {
                uVar15 = local_b8._4_4_;
              }
              lVar12 = local_88 + iStack_b0;
              if (iStack_a0 == 0x7fffffffffffffff) {
                iStack_a0 = 0;
              }
              lVar13 = iStack_a0 + local_38;
              if (local_38 == 0x7fffffffffffffff) {
                lVar13 = 0x7fffffffffffffff;
              }
              uVar11 = uVar11 & 0xffffffff;
              local_e8 = lVar16;
              bVar9 = local_f0 & (byte)local_98;
            }
          }
          local_f0 = bVar9;
          local_b8._0_4_ = (uint)uVar11;
          iVar19 = iVar19 + 1;
          lVar16 = local_e8;
        } while (iVar19 != 3);
        local_d0 = local_60;
        rd = (int64_t *)local_40;
      }
      else {
        local_d0 = local_60;
        local_80 = cpi;
      }
    }
    puVar17 = (uint8_t *)
              (lVar12 * 0x80 + ((long)x->rdmult * (long)(int)((uint)local_b8 + iVar18) + 0x100 >> 9)
              );
    if ((long)puVar17 < (long)orig_dst->plane[0]) {
      orig_dst->plane[0] = puVar17;
      rd_stats->rate = iVar18;
      if ((local_80->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
        if ((int)switchable_ctx == 1) {
          rd_stats_luma->rate = (uint)local_b8;
          rd_stats_luma->zero_rate = uVar15;
          rd_stats_luma->dist = lVar12;
          rd_stats_luma->rdcost = local_e8;
          rd_stats_luma->sse = lVar13;
          rd_stats_luma->skip_txfm = local_f0;
          *(undefined4 *)&rd_stats_luma->field_0x21 = uStack_f8;
          *(uint *)&rd_stats_luma->field_0x24 = CONCAT31(uStack_f4,uStack_f8._3_1_);
          *(byte *)&x->recalc_luma_mc_data = (byte)x->recalc_luma_mc_data ^ 1;
        }
        else if ((int)switchable_ctx == 0) {
          *(uint *)rd = local_d8;
          *(uint *)((long)rd + 4) = local_dc;
          *(long *)((long)rd + 8) = local_d0;
          *(long *)((long)rd + 0x10) = local_70;
          *(long *)((long)rd + 0x18) = local_78;
          *(byte *)((long)rd + 0x20) = local_68;
          rd_stats_luma->rate = (uint)local_b8;
          rd_stats_luma->zero_rate = uVar15;
          rd_stats_luma->dist = lVar12;
          rd_stats_luma->rdcost = local_e8;
          rd_stats_luma->sse = lVar13;
          rd_stats_luma->skip_txfm = local_f0;
          *(undefined4 *)&rd_stats_luma->field_0x21 = uStack_f8;
          *(uint *)&rd_stats_luma->field_0x24 = CONCAT31(uStack_f4,uStack_f8._3_1_);
          x->recalc_luma_mc_data = 0;
        }
        uVar4 = *(undefined8 *)switchable_rate;
        puVar5 = *(undefined8 **)(switchable_rate + 2);
        *(undefined8 **)switchable_rate = puVar5;
        *(undefined8 *)(switchable_rate + 2) = uVar4;
        local_98 = puVar5[4];
        uStack_a8 = puVar5[2];
        iStack_a0 = puVar5[3];
        local_b8 = *puVar5;
        iStack_b0 = puVar5[1];
        pmVar7 = (x->e_mbd).plane;
        lVar12 = 0;
        do {
          pbVar14 = &pmVar7->dst;
          pbVar14->buf = (uint8_t *)(&local_b8)[lVar12];
          pbVar14->stride = *(int *)((long)&iStack_a0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
          pmVar7 = (macroblockd_plane *)(pbVar14 + 0x51);
        } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar12);
        return 1;
      }
      return 1;
    }
  }
  local_90->interp_filters = iVar3;
  return 0;
}

Assistant:

static inline int64_t interpolation_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd,
    RD_STATS *rd_stats_luma, RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], int filter_idx, const int switchable_ctx[2],
    const int skip_pred) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS this_rd_stats_luma, this_rd_stats;

  // Initialize rd_stats structures to default values.
  av1_init_rd_stats(&this_rd_stats_luma);
  this_rd_stats = *rd_stats_luma;
  const int_interpfilters last_best = mbmi->interp_filters;
  mbmi->interp_filters = filter_sets[filter_idx];
  const int tmp_rs =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  int64_t min_rd = RDCOST(x->rdmult, tmp_rs, 0);
  if (min_rd > *rd) {
    mbmi->interp_filters = last_best;
    return 0;
  }

  (void)tile_data;

  assert(skip_pred != 2);
  assert((rd_stats_luma->rate >= 0) && (rd_stats->rate >= 0));
  assert((rd_stats_luma->dist >= 0) && (rd_stats->dist >= 0));
  assert((rd_stats_luma->sse >= 0) && (rd_stats->sse >= 0));
  assert((rd_stats_luma->skip_txfm == 0) || (rd_stats_luma->skip_txfm == 1));
  assert((rd_stats->skip_txfm == 0) || (rd_stats->skip_txfm == 1));
  assert((skip_pred >= 0) &&
         (skip_pred <= interp_search_flags->default_interp_skip_flags));

  // When skip_txfm pred is equal to default_interp_skip_flags,
  // skip both luma and chroma MC.
  // For mono-chrome images:
  // num_planes = 1 and cpi->default_interp_skip_flags = 1,
  // skip_pred = 1: skip both luma and chroma
  // skip_pred = 0: Evaluate luma and as num_planes=1,
  // skip chroma evaluation
  int tmp_skip_pred =
      (skip_pred == interp_search_flags->default_interp_skip_flags)
          ? INTERP_SKIP_LUMA_SKIP_CHROMA
          : skip_pred;

  switch (tmp_skip_pred) {
    case INTERP_EVAL_LUMA_EVAL_CHROMA:
      // skip_pred = 0: Evaluate both luma and chroma.
      // Luma MC
      interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                           &this_rd_stats_luma, 0);
      this_rd_stats = this_rd_stats_luma;
#if CONFIG_COLLECT_RD_STATS == 3
      RD_STATS rd_stats_y;
      av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                          INT64_MAX);
      PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
      AOM_FALLTHROUGH_INTENDED;
    case INTERP_SKIP_LUMA_EVAL_CHROMA:
      // skip_pred = 1: skip luma evaluation (retain previous best luma stats)
      // and do chroma evaluation.
      for (int plane = 1; plane < num_planes; ++plane) {
        int64_t tmp_rd =
            RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);
        if (tmp_rd >= *rd) {
          mbmi->interp_filters = last_best;
          return 0;
        }
        interp_model_rd_eval(x, cpi, bsize, orig_dst, plane, plane,
                             &this_rd_stats, 0);
      }
      break;
    case INTERP_SKIP_LUMA_SKIP_CHROMA:
      // both luma and chroma evaluation is skipped
      this_rd_stats = *rd_stats;
      break;
    case INTERP_EVAL_INVALID:
    default: assert(0); return 0;
  }
  int64_t tmp_rd =
      RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);

  if (tmp_rd < *rd) {
    *rd = tmp_rd;
    *switchable_rate = tmp_rs;
    if (skip_pred != interp_search_flags->default_interp_skip_flags) {
      if (skip_pred == INTERP_EVAL_LUMA_EVAL_CHROMA) {
        // Overwrite the data as current filter is the best one
        *rd_stats_luma = this_rd_stats_luma;
        *rd_stats = this_rd_stats;
        // As luma MC data is computed, no need to recompute after the search
        x->recalc_luma_mc_data = 0;
      } else if (skip_pred == INTERP_SKIP_LUMA_EVAL_CHROMA) {
        // As luma MC data is not computed, update of luma data can be skipped
        *rd_stats = this_rd_stats;
        // As luma MC data is not recomputed and current filter is the best,
        // indicate the possibility of recomputing MC data
        // If current buffer contains valid MC data, toggle to indicate that
        // luma MC data needs to be recomputed
        x->recalc_luma_mc_data ^= 1;
      }
      swap_dst_buf(xd, dst_bufs, num_planes);
    }
    return 1;
  }
  mbmi->interp_filters = last_best;
  return 0;
}